

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int infer_intra(bitstream *str,h264_macroblock *mb,int which)

{
  int iVar1;
  int local_28;
  int i;
  int which_local;
  h264_macroblock *mb_local;
  bitstream *str_local;
  
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    iVar1 = vs_infer(str,mb->ref_idx[which] + local_28,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  local_28 = 0;
  while( true ) {
    if (0xf < local_28) {
      return 0;
    }
    iVar1 = vs_infers(str,mb->mvd[which][local_28],0);
    if (iVar1 != 0) break;
    iVar1 = vs_infers(str,mb->mvd[which][local_28] + 1,0);
    if (iVar1 != 0) {
      return 1;
    }
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

static int infer_intra(struct bitstream *str, struct h264_macroblock *mb, int which) {
	int i;
	for (i = 0; i < 4; i++) {
		if (vs_infer(str, &mb->ref_idx[which][i], 0)) return 1;
	}
	for (i = 0; i < 16; i++) {
		if (vs_infers(str, &mb->mvd[which][i][0], 0)) return 1;
		if (vs_infers(str, &mb->mvd[which][i][1], 0)) return 1;
	}
	return 0;
}